

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

void __thiscall ON_XMLNodePrivate::MoveBefore(ON_XMLNodePrivate *this,ON_XMLNode *other)

{
  int iVar1;
  ON_XMLNode *pOVar2;
  ON_XMLNode *pOVar3;
  bool bVar4;
  undefined4 extraout_var;
  
  if (this->m_node == other) {
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar1 == 0) {
    iVar1 = (*other->_vptr_ON_XMLNode[6])(other);
    pOVar2 = (ON_XMLNode *)CONCAT44(extraout_var,iVar1);
    if (pOVar2 != this->m_node) {
      pOVar3 = PrevSibling(this);
      bVar4 = pOVar3 == (ON_XMLNode *)0x0;
      if (bVar4) {
        pOVar3 = this->m_parent;
      }
      (&pOVar3->_private->m_next_sibling)[(ulong)bVar4 * 2] = this->m_next_sibling;
      this->m_next_sibling = other;
      bVar4 = pOVar2 == (ON_XMLNode *)0x0;
      if (bVar4) {
        pOVar2 = this->m_parent;
      }
      (&pOVar2->_private->m_next_sibling)[(ulong)bVar4 * 2] = this->m_node;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ON_XMLNodePrivate::MoveBefore(ON_XMLNode& other)
{
  if (&other == &m_node)
    return;

  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  auto* pBeforeOther = other.PrevSibling();
  if (pBeforeOther == &m_node)
    return;

  auto* pPrev = PrevSibling();
  if (nullptr != pPrev)
  {
    pPrev->_private->m_next_sibling = m_next_sibling;
  }
  else
  {
    // 'this' was the head; redirect the parent's first child.
    m_parent->_private->m_first_child = m_next_sibling;
  }

  m_next_sibling = &other;

  if (nullptr == pBeforeOther)
  {
    // 'other' was the head; redirect the parent's first child.
    m_parent->_private->m_first_child = &m_node;
  }
  else
  {
    pBeforeOther->_private->m_next_sibling = &m_node;
  }
}